

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGValidErrorPop(xmlRelaxNGValidCtxtPtr ctxt)

{
  long lVar1;
  int iVar2;
  long lVar3;
  xmlRelaxNGValidErrorPtr pxVar4;
  
  iVar2 = ctxt->errNr;
  lVar3 = (long)iVar2;
  if (0 < lVar3) {
    lVar1 = lVar3 + -1;
    ctxt->errNr = (int)lVar1;
    if (iVar2 == 1) {
      pxVar4 = (xmlRelaxNGValidErrorPtr)0x0;
    }
    else {
      pxVar4 = ctxt->errTab + lVar3 + -2;
    }
    ctxt->err = pxVar4;
    pxVar4 = ctxt->errTab;
    if ((pxVar4[lVar1].flags & 1) != 0) {
      if (pxVar4[lVar1].arg1 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar4[lVar1].arg1);
      }
      pxVar4[lVar1].arg1 = (xmlChar *)0x0;
      if (pxVar4[lVar1].arg2 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar4[lVar1].arg2);
      }
      pxVar4[lVar1].arg2 = (xmlChar *)0x0;
      pxVar4[lVar1].flags = 0;
    }
    return;
  }
  ctxt->err = (xmlRelaxNGValidErrorPtr)0x0;
  return;
}

Assistant:

static void
xmlRelaxNGValidErrorPop(xmlRelaxNGValidCtxtPtr ctxt)
{
    xmlRelaxNGValidErrorPtr cur;

    if (ctxt->errNr <= 0) {
        ctxt->err = NULL;
        return;
    }
    ctxt->errNr--;
    if (ctxt->errNr > 0)
        ctxt->err = &ctxt->errTab[ctxt->errNr - 1];
    else
        ctxt->err = NULL;
    cur = &ctxt->errTab[ctxt->errNr];
    if (cur->flags & ERROR_IS_DUP) {
        if (cur->arg1 != NULL)
            xmlFree((xmlChar *) cur->arg1);
        cur->arg1 = NULL;
        if (cur->arg2 != NULL)
            xmlFree((xmlChar *) cur->arg2);
        cur->arg2 = NULL;
        cur->flags = 0;
    }
}